

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCodabarReader.cpp
# Opt level: O3

Barcode * __thiscall
ZXing::OneD::CodabarReader::decodePattern
          (Barcode *__return_storage_ptr__,CodabarReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  ushort *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  Iterator puVar4;
  Iterator puVar5;
  long lVar6;
  ushort uVar7;
  long lVar8;
  uint local_b4;
  string txt;
  Error local_80;
  long *local_50 [2];
  long local_40 [2];
  
  FindLeftGuard<7,bool(*)(ZXing::PatternView_const&,int)>
            ((PatternView *)&txt,(ZXing *)next,(PatternView *)0x1c,0x15b0a8,
             (_func_bool_PatternView_ptr_int *)param_3);
  next->_base = (Iterator)
                CONCAT71(txt.field_2._M_allocated_capacity._1_7_,txt.field_2._M_local_buf[0]);
  next->_end = (Iterator)txt.field_2._8_8_;
  next->_data = (Iterator)txt._M_dataplus._M_p;
  *(size_type *)&next->_size = txt._M_string_length;
  puVar4 = next->_data;
  puVar5 = next->_base;
  if (puVar4 < puVar5 || puVar4 == (Iterator)0x0) {
LAB_0015b199:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  iVar3 = next->_size;
  if (next->_end < puVar4 + iVar3) goto LAB_0015b199;
  if (puVar5 == puVar4) {
    local_b4 = 0;
  }
  else {
    uVar7 = 0;
    do {
      uVar7 = uVar7 + *puVar5;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar4);
    local_b4 = (uint)uVar7;
  }
  if (iVar3 == 0) {
    uVar7 = 0;
  }
  else {
    lVar6 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + *(short *)((long)puVar4 + lVar6);
      lVar6 = lVar6 + 2;
    } while ((long)iVar3 * 2 != lVar6);
    uVar7 = uVar7 >> 1;
  }
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&txt);
  iVar3 = RowReader::NarrowWideBitPattern(next);
  RowReader::LookupBitPattern<int[20],char[21]>
            (iVar3,(int (*) [20])CHARACTER_ENCODINGS,(char (*) [21])ALPHABET);
  std::__cxx11::string::push_back((char)&txt);
  if ((byte)(txt._M_dataplus._M_p[txt._M_string_length - 1] + 0xbfU) < 4) {
    do {
      if (next->_data == (Iterator)0x0) goto LAB_0015b2fc;
      lVar6 = (long)next->_size;
      puVar1 = next->_data + lVar6;
      next->_data = puVar1;
      if (((next->_end < puVar1 + lVar6) ||
          (next->_data = puVar1 + 1, next->_end < puVar1 + lVar6 + 1)) || (uVar7 < *puVar1))
      goto LAB_0015b2fc;
      iVar3 = RowReader::NarrowWideBitPattern(next);
      RowReader::LookupBitPattern<int[20],char[21]>
                (iVar3,(int (*) [20])CHARACTER_ENCODINGS,(char (*) [21])ALPHABET);
      std::__cxx11::string::push_back((char)&txt);
      if (txt._M_dataplus._M_p[txt._M_string_length - 1] == '\0') goto LAB_0015b2fc;
    } while (3 < (byte)(txt._M_dataplus._M_p[txt._M_string_length - 1] + 0xbfU));
    if (3 < (int)txt._M_string_length) {
      puVar4 = next->_data;
      lVar6 = (long)next->_size;
      if ((puVar4 + lVar6 != next->_end + -1) && (next->_size != 0)) {
        lVar8 = 0;
        uVar7 = 0;
        do {
          uVar7 = uVar7 + *(short *)((long)puVar4 + lVar8);
          lVar8 = lVar8 + 2;
        } while (lVar6 * 2 != lVar8);
        if ((float)puVar4[lVar6] < (float)uVar7 * 0.5) goto LAB_0015b2fc;
      }
      if ((((this->super_RowReader)._opts)->field_0x1 & 1) == 0) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&txt);
        std::__cxx11::string::operator=((string *)&txt,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        puVar4 = next->_data;
        lVar6 = (long)next->_size;
      }
      puVar5 = next->_base;
      if (puVar5 == puVar4 + lVar6) {
        iVar3 = -1;
      }
      else {
        uVar7 = 0;
        do {
          uVar7 = uVar7 + *puVar5;
          puVar5 = puVar5 + 1;
        } while (puVar5 != puVar4 + lVar6);
        iVar3 = uVar7 - 1;
      }
      paVar2 = &local_80._msg.field_2;
      local_80._msg.field_2._M_allocated_capacity = 0;
      local_80._msg.field_2._8_8_ = 0;
      local_80._msg._M_string_length = 0;
      local_80._file = (char *)0x0;
      local_80._line = -1;
      local_80._type = None;
      local_80._43_5_ = 0;
      local_80._msg._M_dataplus._M_p = (pointer)paVar2;
      Result::Result(__return_storage_ptr__,&txt,rowNumber,local_b4,iVar3,Codabar,
                     (SymbologyIdentifier)0x3046,&local_80,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._msg._M_dataplus._M_p != paVar2) {
        operator_delete(local_80._msg._M_dataplus._M_p,
                        local_80._msg.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0015b313;
    }
  }
LAB_0015b2fc:
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
LAB_0015b313:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)txt._M_dataplus._M_p == &txt.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(txt._M_dataplus._M_p,
                  CONCAT71(txt.field_2._M_allocated_capacity._1_7_,txt.field_2._M_local_buf[0]) + 1)
  ;
  return __return_storage_ptr__;
}

Assistant:

Barcode CodabarReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop and checksum characters)
	// absolute minimum would be 2 (meaning 0 'content'). everything below 4 produces too many false
	// positives.
	const int minCharCount = 4;
	auto isStartOrStopSymbol = [](char c) { return 'A' <= c && c <= 'D'; };

	next = FindLeftGuard<CHAR_LEN>(next, minCharCount * CHAR_LEN, IsLeftGuard);
	if (!next.isValid())
		return {};

	int xStart = next.pixelsInFront();
	int maxInterCharacterSpace = next.sum() / 2; // spec actually says 1 narrow space, width/2 is about 4

	std::string txt;
	txt.reserve(20);
	txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET); // read off the start pattern

	if (!isStartOrStopSymbol(txt.back()))
		return {};

	do {
		// check remaining input width and inter-character space
		if (!next.skipSymbol() || !next.skipSingle(maxInterCharacterSpace))
			return {};

		txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (!isStartOrStopSymbol(txt.back()));

	// next now points to the last decoded symbol
	// check txt length and whitespace after the last char. See also FindStartPattern.
	if (Size(txt) < minCharCount || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	// remove stop/start characters
	if (!_opts.returnCodabarStartEnd())
		txt = txt.substr(1, txt.size() - 2);

	// symbology identifier ISO/IEC 15424:2008 4.4.9
	// if checksum processing were implemented and checksum present and stripped then modifier would be 4
	SymbologyIdentifier symbologyIdentifier = {'F', '0'};

	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::Codabar, symbologyIdentifier);
}